

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h265e_ps.c
# Opt level: O1

MPP_RET h265e_set_sps(H265eCtx *ctx,H265eSps *sps,H265eVps *vps)

{
  byte bVar1;
  MppFrameFormat MVar2;
  RK_U32 RVar3;
  RK_U32 RVar4;
  MppFrameColorPrimaries MVar5;
  MppFrameColorTransferCharacteristic MVar6;
  MppFrameColorSpace MVar7;
  MppEncCfgSet *pMVar8;
  bool bVar9;
  char cVar10;
  int iVar11;
  RockchipSocType RVar12;
  uint uVar13;
  MppEncCpbInfo *pMVar14;
  RK_U32 *pRVar15;
  ulong uVar16;
  RK_S32 *pRVar17;
  uint uVar18;
  uint uVar19;
  uint uVar20;
  int iVar21;
  int iVar22;
  RK_U32 RVar23;
  uint uVar24;
  RK_U32 *tmp;
  RK_U8 convertToBit [129];
  RK_U32 *local_c0;
  byte local_b8 [136];
  
  pMVar8 = ctx->cfg;
  MVar2 = (pMVar8->prep).format;
  RVar3 = (pMVar8->rc).fps_out_num;
  RVar4 = (pMVar8->rc).fps_out_denom;
  pMVar14 = mpp_enc_ref_cfg_get_cpb_info(pMVar8->ref_cfg);
  local_c0 = sps->zscan2raster;
  memset(local_b8,0xff,0x81);
  iVar11 = 0;
  uVar13 = 4;
  do {
    local_b8[uVar13] = (byte)iVar11;
    iVar11 = iVar11 + 1;
    uVar13 = uVar13 * 2;
  } while (iVar11 != 6);
  iVar11 = (pMVar8->codec).field_1.h265.max_cu_size;
  bVar1 = local_b8[iVar11];
  RVar12 = mpp_get_soc_type();
  RVar23 = 0;
  do {
    cVar10 = (char)RVar23;
    RVar23 = RVar23 + 1;
  } while ((uint)(1 << (cVar10 + 2U & 0x1f)) <
           (uint)((pMVar8->codec).field_1.h265.max_cu_size >> (bVar1 & 0x1f)));
  uVar20 = iVar11 >> (bVar1 - 1 & 0x1f);
  uVar24 = (bVar1 + RVar23) - 1;
  init_zscan2raster(bVar1 + RVar23,1,0,&local_c0);
  uVar13 = (pMVar8->codec).field_1.h264.hw_cfg.hw_poc_type;
  uVar13 = uVar13 / (uVar13 >> ((byte)uVar24 & 0x1f));
  uVar13 = uVar13 * uVar13;
  if (uVar13 != 0) {
    uVar16 = 0;
    do {
      sps->raster2zscan[sps->zscan2raster[uVar16]] = (RK_U32)uVar16;
      uVar16 = uVar16 + 1;
    } while (uVar16 < uVar13);
  }
  init_raster2pelxy((pMVar8->codec).field_1.h264.hw_cfg.hw_poc_type,bVar1 + RVar23,sps->raster2pelx,
                    sps->raster2pely);
  (sps->m_conformanceWindow).m_enabledFlag = 0;
  (sps->m_conformanceWindow).m_winLeftOffset = 0;
  (sps->m_conformanceWindow).m_winRightOffset = 0;
  (sps->m_conformanceWindow).m_winTopOffset = 0;
  (sps->m_conformanceWindow).m_winBottomOffset = 0;
  uVar13 = (pMVar8->prep).width;
  uVar18 = uVar13 % uVar20;
  iVar11 = 0;
  if (uVar18 != 0) {
    iVar11 = uVar20 - uVar18;
    (sps->m_conformanceWindow).m_enabledFlag = 1;
    (sps->m_conformanceWindow).m_winRightOffset = iVar11;
  }
  uVar18 = (pMVar8->prep).height;
  iVar22 = 0;
  uVar19 = uVar18 % uVar20;
  iVar21 = 0;
  if (uVar19 != 0) {
    iVar21 = uVar20 - uVar19;
    (sps->m_conformanceWindow).m_enabledFlag = 1;
    (sps->m_conformanceWindow).m_winBottomOffset = iVar21;
  }
  sps->m_SPSId = 0;
  sps->m_VPSId = 0;
  sps->m_chromaFormatIdc = (uint)(MVar2 != MPP_FMT_YUV400);
  uVar20 = vps->m_maxLayers;
  sps->m_maxTLayers = uVar20;
  sps->m_picWidthInLumaSamples = iVar11 + uVar13;
  sps->m_picHeightInLumaSamples = iVar21 + uVar18;
  sps->m_log2MinCodingBlockSize = 0;
  sps->m_log2DiffMaxMinCodingBlockSize = 0;
  uVar13 = (pMVar8->codec).field_1.h264.hw_cfg.hw_poc_type;
  sps->m_maxCUSize = uVar13;
  sps->m_maxCUDepth = uVar24;
  sps->m_addCUDepth = RVar23;
  (sps->m_RPSList).m_numberOfReferencePictureSets = 0;
  (sps->m_RPSList).m_referencePictureSets = (H265eReferencePictureSet *)0x0;
  uVar18 = uVar24 - RVar23;
  uVar13 = uVar13 >> ((byte)uVar18 & 0x1f);
  if (1 < (int)uVar13) {
    iVar22 = 0;
    do {
      iVar22 = iVar22 + 1;
      bVar9 = 3 < uVar13;
      uVar13 = uVar13 >> 1;
    } while (bVar9);
  }
  sps->m_log2MinCodingBlockSize = iVar22;
  sps->m_log2DiffMaxMinCodingBlockSize = uVar18;
  sps->m_pcmLog2MaxSize = 5;
  sps->m_pcmLog2MinSize = 3;
  sps->m_bLongTermRefsPresent = 0;
  sps->m_quadtreeTULog2MaxSize = (RVar12 - ROCKCHIP_SOC_RK3576 < 2) + 1 + (uint)bVar1;
  sps->m_quadtreeTULog2MinSize = 2;
  sps->m_quadtreeTUMaxDepthInter = 1;
  sps->m_quadtreeTUMaxDepthIntra = 1;
  sps->m_usePCM = 0;
  sps->m_useLossless = 0;
  if (bVar1 != 1) {
    uVar16 = 0;
    do {
      sps->m_iAMPAcc[uVar16] = (pMVar8->codec).field_1.h264.hw_cfg.hw_split_out;
      uVar16 = uVar16 + 1;
    } while (uVar18 != uVar16);
  }
  sps->m_useAMP = (pMVar8->codec).field_1.h264.hw_cfg.hw_split_out;
  if (uVar18 < uVar24) {
    pRVar17 = sps->m_iAMPAcc + uVar18;
    do {
      *pRVar17 = (pMVar8->codec).field_1.h264.hw_cfg.hw_split_out;
      pRVar17 = pRVar17 + 1;
      RVar23 = RVar23 - 1;
    } while (RVar23 != 0);
  }
  sps->m_bitDepthY = 8;
  sps->m_bitDepthC = 8;
  sps->m_qpBDOffsetY = 0;
  sps->m_qpBDOffsetC = 0;
  sps->m_bUseSAO = (pMVar8->codec).field_1.h264.entropy_coding_mode;
  sps->m_bTemporalIdNestingFlag = 1;
  if ((ulong)uVar20 != 0) {
    uVar16 = 0;
    do {
      sps->m_maxDecPicBuffering[uVar16] = vps->m_maxDecPicBuffering[uVar16];
      sps->m_numReorderPics[uVar16] = vps->m_numReorderPics[uVar16];
      uVar16 = uVar16 + 1;
    } while (uVar20 != uVar16);
  }
  sps->m_pcmBitDepthLuma = 8;
  sps->m_pcmBitDepthChroma = 8;
  sps->m_bPCMFilterDisableFlag = 0;
  sps->m_scalingListEnabledFlag =
       (uint)((pMVar8->codec).field_1.h265.trans_cfg.defalut_ScalingList_enable != 0);
  sps->m_bitsForPOC = 0x10;
  sps->m_numLongTermRefPicSPS = 0;
  sps->m_maxTrSize = 0x20;
  sps->m_bLongTermRefsPresent = 0;
  sps->m_TMVPFlagsPresent = (pMVar8->codec).field_1.h264.hw_cfg.hw_log2_max_frame_num_minus4;
  sps->m_useStrongIntraSmoothing =
       (pMVar8->codec).field_1.h265.cu_cfg.strong_intra_smoothing_enabled_flag;
  if (pMVar14->max_lt_cnt == 0) {
    if (pMVar14->max_st_tid == 0) goto LAB_001d3af8;
    pRVar15 = &sps->m_TMVPFlagsPresent;
  }
  else {
    pRVar15 = &(pMVar8->codec).field_1.h264.hw_cfg.hw_log2_max_frame_num_minus4;
    sps->m_numLongTermRefPicSPS = pMVar14->max_lt_cnt;
    sps->m_bLongTermRefsPresent = 1;
    sps->m_TMVPFlagsPresent = 0;
  }
  *pRVar15 = 0;
LAB_001d3af8:
  if ((pMVar8->rc).drop_mode == MPP_ENC_RC_DROP_FRM_PSKIP) {
    (pMVar8->codec).field_1.h264.hw_cfg.hw_log2_max_frame_num_minus4 = 0;
    sps->m_TMVPFlagsPresent = 0;
    (pMVar8->codec).field_1.h264.entropy_coding_mode = 0;
    sps->m_bUseSAO = 0;
  }
  sps->m_ptl = &vps->m_ptl;
  sps->m_vuiParametersPresentFlag = 1;
  (sps->vui).m_aspectRatioInfoPresentFlag = 0;
  (sps->vui).m_aspectRatioIdc = 0;
  (sps->vui).m_sarWidth = 0;
  (sps->vui).m_sarHeight = 0;
  (sps->vui).m_sarHeight = 0;
  (sps->vui).m_overscanInfoPresentFlag = 0;
  (sps->vui).m_overscanAppropriateFlag = 0;
  (sps->vui).m_videoSignalTypePresentFlag = 0;
  (sps->vui).m_videoFormat = 5;
  if ((pMVar8->prep).range == MPP_FRAME_RANGE_JPEG) {
    (sps->vui).m_videoFullRangeFlag = 1;
    (sps->vui).m_videoSignalTypePresentFlag = 1;
  }
  MVar5 = (pMVar8->prep).colorprim;
  if (((MVar5 < MPP_FRAME_PRI_NB && MVar5 != MPP_FRAME_PRI_UNSPECIFIED) ||
      (MVar6 = (pMVar8->prep).colortrc,
      MVar6 < MPP_FRAME_TRC_NB && MVar6 != MPP_FRAME_TRC_UNSPECIFIED)) ||
     (MVar7 = (pMVar8->prep).color, MVar7 != MPP_FRAME_SPC_UNSPECIFIED && MVar7 < MPP_FRAME_SPC_NB))
  {
    (sps->vui).m_videoSignalTypePresentFlag = 1;
    (sps->vui).m_colourDescriptionPresentFlag = 1;
    (sps->vui).m_colourPrimaries = MVar5;
    (sps->vui).m_transferCharacteristics = (pMVar8->prep).colortrc;
    (sps->vui).m_matrixCoefficients = (pMVar8->prep).color;
  }
  (sps->vui).m_chromaLocInfoPresentFlag = 0;
  (sps->vui).m_chromaSampleLocTypeTopField = 0;
  (sps->vui).m_chromaSampleLocTypeBottomField = 0;
  (sps->vui).m_neutralChromaIndicationFlag = 0;
  (sps->vui).m_fieldSeqFlag = 0;
  (sps->vui).m_frameFieldInfoPresentFlag = 0;
  (sps->vui).m_hrdParametersPresentFlag = 0;
  (sps->vui).m_bitstreamRestrictionFlag = 0;
  (sps->vui).m_tilesFixedStructureFlag = 0;
  (sps->vui).m_motionVectorsOverPicBoundariesFlag = 1;
  (sps->vui).m_restrictedRefPicListsFlag = 1;
  (sps->vui).m_minSpatialSegmentationIdc = 0;
  (sps->vui).m_maxBytesPerPicDenom = 2;
  (sps->vui).m_maxBitsPerMinCuDenom = 1;
  (sps->vui).m_log2MaxMvLengthHorizontal = 0xf;
  (sps->vui).m_log2MaxMvLengthVertical = 0xf;
  iVar11 = (pMVar8->codec).field_1.h265.vui.vui_aspect_ratio;
  if (iVar11 != 0) {
    (sps->vui).m_aspectRatioInfoPresentFlag = 1;
    (sps->vui).m_aspectRatioIdc = iVar11;
  }
  (sps->vui).m_timingInfo.m_timingInfoPresentFlag = 1;
  (sps->vui).m_timingInfo.m_numUnitsInTick = RVar4;
  (sps->vui).m_timingInfo.m_timeScale = RVar3;
  sps->m_maxLatencyIncrease[0] = 0;
  sps->m_maxLatencyIncrease[1] = 0;
  sps->m_maxLatencyIncrease[2] = 0;
  sps->m_maxLatencyIncrease[3] = 0;
  sps->m_maxLatencyIncrease[3] = 0;
  sps->m_maxLatencyIncrease[4] = 0;
  sps->m_maxLatencyIncrease[5] = 0;
  sps->m_maxLatencyIncrease[6] = 0;
  memset(sps->m_ltRefPicPocLsbSps,0,0x108);
  return MPP_OK;
}

Assistant:

MPP_RET h265e_set_sps(H265eCtx *ctx, H265eSps *sps, H265eVps *vps)
{
    RK_U32 i, c;
    MppEncH265Cfg *codec = &ctx->cfg->codec.h265;
    MppEncPrepCfg *prep = &ctx->cfg->prep;
    MppEncRcCfg *rc = &ctx->cfg->rc;
    MppEncRefCfg ref_cfg = ctx->cfg->ref_cfg;
    MppEncH265VuiCfg *vui = &codec->vui;
    MppFrameFormat fmt = prep->format;
    RK_S32 i_timebase_num = rc->fps_out_denom;
    RK_S32 i_timebase_den = rc->fps_out_num;
    RK_U8  convertToBit[MAX_CU_SIZE + 1];
    RK_U32 maxCUDepth, minCUDepth, addCUDepth;
    RK_S32 pad[2] = {0};
    RK_S32 minCUSize, log2MinCUSize;
    RK_S32 tuQTMinLog2Size = 2, tuQTMaxLog2Size;
    MppEncCpbInfo *cpb_info = mpp_enc_ref_cfg_get_cpb_info(ref_cfg);
    RockchipSocType soc_type;
    RK_U32 *tmp = &sps->zscan2raster[0];

    memset(convertToBit, -1, sizeof(convertToBit));
    c = 0;
    for (i = 4; i <= MAX_CU_SIZE; i *= 2) {
        convertToBit[i] = c;
        c++;
    }

    maxCUDepth = (uint32_t)convertToBit[codec->max_cu_size];

    minCUDepth = (codec->max_cu_size >> (maxCUDepth - 1));

    tuQTMaxLog2Size = convertToBit[codec->max_cu_size] + 2 - 1;
    soc_type = mpp_get_soc_type();
    if (soc_type == ROCKCHIP_SOC_RK3576 || soc_type == ROCKCHIP_SOC_RV1126B) {
        tuQTMaxLog2Size = tuQTMaxLog2Size + 1;
    }

    addCUDepth = 0;
    while ((RK_U32)(codec->max_cu_size >> maxCUDepth) > (1u << (tuQTMinLog2Size + addCUDepth))) {
        addCUDepth++;
    }

    maxCUDepth += addCUDepth;
    addCUDepth++;
    init_zscan2raster(maxCUDepth + 1, 1, 0, &tmp );
    init_raster2zscan(codec->max_cu_size, maxCUDepth + 1, &sps->raster2zscan[0], &sps->zscan2raster[0]);
    init_raster2pelxy(codec->max_cu_size, maxCUDepth + 1, &sps->raster2pelx[0], &sps->raster2pely[0]);

    memset(&sps->m_conformanceWindow, 0, sizeof(H265eCropInfo));
    if ((prep->width % minCUDepth) != 0) {
        RK_U32 padsize = 0;
        RK_U32 rem = prep->width % minCUDepth;
        padsize = minCUDepth - rem;
        pad[0] = padsize; //pad width

        /* set the confirmation window offsets  */
        sps->m_conformanceWindow.m_enabledFlag = 1;
        sps->m_conformanceWindow.m_winRightOffset = pad[0];
    }

    if ((prep->height % minCUDepth) != 0) {
        RK_U32 padsize = 0;
        RK_U32 rem = prep->height % minCUDepth;
        padsize = minCUDepth - rem;
        pad[1] = padsize; //pad height

        /* set the confirmation window offsets  */
        sps->m_conformanceWindow.m_enabledFlag = 1;
        sps->m_conformanceWindow.m_winBottomOffset = pad[1];
    }
    // pad[0] = p->sourceWidth - p->oldSourceWidth;
    // pad[1] = p->sourceHeight - p->oldSourceHeight;

    sps->m_SPSId = 0;
    sps->m_VPSId = 0;
    sps->m_chromaFormatIdc = (fmt == MPP_FMT_YUV400) ? H265_CHROMA_400 : H265_CHROMA_420;
    sps->m_maxTLayers = vps->m_maxLayers;
    sps->m_picWidthInLumaSamples = prep->width + pad[0];
    sps->m_picHeightInLumaSamples = prep->height + pad[1];
    sps->m_log2MinCodingBlockSize = 0;
    sps->m_log2DiffMaxMinCodingBlockSize = 0 ;
    sps->m_maxCUSize = codec->max_cu_size;
    sps->m_maxCUDepth = maxCUDepth;
    sps->m_addCUDepth = addCUDepth;
    sps->m_RPSList.m_numberOfReferencePictureSets = 0;
    sps->m_RPSList.m_referencePictureSets = NULL;

    minCUSize = sps->m_maxCUSize >> (sps->m_maxCUDepth - addCUDepth);
    log2MinCUSize = 0;
    while (minCUSize > 1) {
        minCUSize >>= 1;
        log2MinCUSize++;
    }
    sps->m_log2MinCodingBlockSize = log2MinCUSize;
    sps->m_log2DiffMaxMinCodingBlockSize = sps->m_maxCUDepth - addCUDepth;

    sps->m_pcmLog2MaxSize = 5;
    sps->m_usePCM = 0;
    sps->m_pcmLog2MinSize = 3;


    sps->m_bLongTermRefsPresent = 0;
    sps->m_quadtreeTULog2MaxSize =  tuQTMaxLog2Size;
    sps->m_quadtreeTULog2MinSize = tuQTMinLog2Size;
    sps->m_quadtreeTUMaxDepthInter = 1;     //tuQTMaxInterDepth
    sps->m_quadtreeTUMaxDepthIntra = 1;     //tuQTMaxIntraDepth
    sps->m_useLossless = 0;

    for (i = 0; i < (maxCUDepth - addCUDepth); i++) {
        sps->m_iAMPAcc[i] = codec->amp_enable;
    }
    sps->m_useAMP = codec->amp_enable;
    for (i = maxCUDepth - addCUDepth; i < maxCUDepth; i++) {
        sps->m_iAMPAcc[i] = codec->amp_enable;
    }

    sps->m_bitDepthY = 8;
    sps->m_bitDepthC = 8;
    sps->m_qpBDOffsetY = 0;
    sps->m_qpBDOffsetC = 0;

    sps->m_bUseSAO = codec->sao_enable;
    sps->m_bTemporalIdNestingFlag = 1;

    for (i = 0; i < sps->m_maxTLayers; i++) {
        sps->m_maxDecPicBuffering[i] = vps->m_maxDecPicBuffering[i];
        sps->m_numReorderPics[i] = vps->m_numReorderPics[i];
    }

    sps->m_pcmBitDepthLuma = 8;
    sps->m_pcmBitDepthChroma = 8;

    sps->m_bPCMFilterDisableFlag = 0;
    sps->m_scalingListEnabledFlag = codec->trans_cfg.defalut_ScalingList_enable == 0 ? 0 : 1;

    sps->m_bitsForPOC = 16;
    sps->m_numLongTermRefPicSPS = 0;
    sps->m_maxTrSize = 32;
    sps->m_bLongTermRefsPresent = 0;
    sps->m_TMVPFlagsPresent = codec->tmvp_enable;
    sps->m_useStrongIntraSmoothing = codec->cu_cfg.strong_intra_smoothing_enabled_flag;
    if (cpb_info->max_lt_cnt) {
        sps->m_numLongTermRefPicSPS = cpb_info->max_lt_cnt;
        sps->m_bLongTermRefsPresent = 1;
        sps->m_TMVPFlagsPresent = 0;
        codec->tmvp_enable = 0;
    } else if (cpb_info->max_st_tid) {
        sps->m_TMVPFlagsPresent = 0;
    }

    if (rc->drop_mode == MPP_ENC_RC_DROP_FRM_PSKIP) {
        codec->tmvp_enable = 0;
        sps->m_TMVPFlagsPresent = 0;
        codec->sao_enable = 0;
        sps->m_bUseSAO = 0;
    }

    sps->m_ptl = &vps->m_ptl;
    sps->m_vuiParametersPresentFlag = 1;
    if (sps->m_vuiParametersPresentFlag) {
        sps->vui.m_aspectRatioInfoPresentFlag = 0;
        sps->vui.m_aspectRatioIdc = 0;
        sps->vui.m_sarWidth = 0;
        sps->vui.m_sarHeight = 0;
        sps->vui.m_overscanInfoPresentFlag = 0;
        sps->vui.m_overscanAppropriateFlag = 0;
        sps->vui.m_videoSignalTypePresentFlag = 0;
        sps->vui.m_videoFormat = MPP_FRAME_VIDEO_FMT_UNSPECIFIED;
        if (prep->range == MPP_FRAME_RANGE_JPEG) {
            sps->vui.m_videoFullRangeFlag = 1;
            sps->vui.m_videoSignalTypePresentFlag = 1;
        }

        if ((prep->colorprim <= MPP_FRAME_PRI_JEDEC_P22 &&
             prep->colorprim != MPP_FRAME_PRI_UNSPECIFIED) ||
            (prep->colortrc <= MPP_FRAME_TRC_ARIB_STD_B67 &&
             prep->colortrc != MPP_FRAME_TRC_UNSPECIFIED) ||
            (prep->color <= MPP_FRAME_SPC_ICTCP &&
             prep->color != MPP_FRAME_SPC_UNSPECIFIED)) {
            sps->vui.m_videoSignalTypePresentFlag = 1;
            sps->vui.m_colourDescriptionPresentFlag = 1;
            sps->vui.m_colourPrimaries = prep->colorprim;
            sps->vui.m_transferCharacteristics = prep->colortrc;
            sps->vui.m_matrixCoefficients = prep->color;
        }

        sps->vui.m_chromaLocInfoPresentFlag = 0;
        sps->vui.m_chromaSampleLocTypeTopField = 0;
        sps->vui.m_chromaSampleLocTypeBottomField = 0;
        sps->vui.m_neutralChromaIndicationFlag = 0;
        sps->vui.m_fieldSeqFlag = 0;
        sps->vui.m_frameFieldInfoPresentFlag = 0;
        sps->vui.m_hrdParametersPresentFlag = 0;
        sps->vui.m_bitstreamRestrictionFlag = 0;
        sps->vui.m_tilesFixedStructureFlag = 0;
        sps->vui.m_motionVectorsOverPicBoundariesFlag = 1;
        sps->vui.m_restrictedRefPicListsFlag = 1;
        sps->vui.m_minSpatialSegmentationIdc = 0;
        sps->vui.m_maxBytesPerPicDenom = 2;
        sps->vui.m_maxBitsPerMinCuDenom = 1;
        sps->vui.m_log2MaxMvLengthHorizontal = 15;
        sps->vui.m_log2MaxMvLengthVertical = 15;
        if (vui->vui_aspect_ratio) {
            sps->vui.m_aspectRatioInfoPresentFlag = !!vui->vui_aspect_ratio;
            sps->vui.m_aspectRatioIdc = vui->vui_aspect_ratio;
        }
        sps->vui.m_timingInfo.m_timingInfoPresentFlag = 1;
        sps->vui.m_timingInfo.m_numUnitsInTick = i_timebase_num;
        sps->vui.m_timingInfo.m_timeScale = i_timebase_den;
    }



    for (i = 0; i < MAX_SUB_LAYERS; i++) {
        sps->m_maxLatencyIncrease[i] = 0;
    }
    //  sps->m_scalingList = NULL;
    memset(sps->m_ltRefPicPocLsbSps, 0, sizeof(sps->m_ltRefPicPocLsbSps));
    memset(sps->m_usedByCurrPicLtSPSFlag, 0, sizeof(sps->m_usedByCurrPicLtSPSFlag));
    return 0;
}